

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int set_field_buffer(FIELD *field,int buffer,char *value)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  int *piVar10;
  ushort **ppuVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  iVar6 = -2;
  if ((((buffer < 0) || (field == (FIELD *)0x0)) || (value == (char *)0x0)) ||
     (field->nbuf < buffer)) goto LAB_0030334e;
  uVar13 = field->dcols * field->drows;
  if (buffer == 0) {
    for (lVar9 = 0; (bVar2 = value[lVar9], (ulong)bVar2 != 0 && ((uint)lVar9 < uVar13));
        lVar9 = lVar9 + 1) {
      ppuVar11 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar11 + (ulong)bVar2 * 2 + 1) & 0x40) == 0) goto LAB_0030334e;
    }
  }
  uVar14 = uVar13;
  if ((field->status & 8) != 0) {
    sVar8 = strlen(value);
    uVar5 = (uint)sVar8;
    if (uVar13 <= uVar5 && uVar5 - uVar13 != 0) {
      _Var4 = Field_Grown(field,(uVar5 - uVar13) /
                                (uint)((int)field->cols * ((int)field->rows + field->nrow)) + 1);
      if (!_Var4) {
        iVar6 = -1;
        goto LAB_0030334e;
      }
      uVar14 = uVar5;
      if (buffer == 0) {
        uVar15 = (ulong)uVar13;
        do {
          if ((sVar8 & 0xffffffff) <= uVar15) goto LAB_00303286;
          ppuVar11 = __ctype_b_loc();
          pcVar3 = value + uVar15;
          uVar15 = uVar15 + 1;
        } while ((*(byte *)((long)*ppuVar11 + (long)*pcVar3 * 2 + 1) & 0x40) != 0);
        goto LAB_0030334e;
      }
    }
  }
LAB_00303286:
  iVar6 = (field->dcols * field->drows + 1) * buffer;
  pcVar3 = field->buf;
  lVar9 = 0;
  lVar12 = 0;
  while( true ) {
    cVar1 = value[lVar9];
    if ((cVar1 == '\0') || (value + uVar14 <= value + lVar9)) break;
    pcVar3[lVar9 + iVar6] = cVar1;
    lVar12 = lVar12 + 0x100000000;
    lVar9 = lVar9 + 1;
  }
  if (value + lVar9 < value + uVar14) {
    pcVar3[(lVar12 >> 0x20) + (long)iVar6] = cVar1;
    uVar13 = (uint)lVar9;
    if (uVar14 < uVar13) {
      __assert_fail("len >= (unsigned int)(s-p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                    ,0xf09,"int set_field_buffer(FIELD *, int, const char *)");
    }
    if (uVar13 < uVar14) {
      memset(pcVar3 + lVar9 + iVar6,0x20,(ulong)(uVar14 - uVar13));
    }
  }
  iVar6 = 0;
  if (buffer == 0) {
    iVar7 = Synchronize_Field(field);
    iVar6 = Synchronize_Linked_Fields(field);
    if (iVar6 == 0) {
      iVar6 = iVar7;
    }
    if (iVar7 != 0) {
      iVar6 = iVar7;
    }
  }
LAB_0030334e:
  piVar10 = __errno_location();
  *piVar10 = iVar6;
  return iVar6;
}

Assistant:

int set_field_buffer(FIELD * field, int buffer, const char * value)
{
  char *s, *p;
  int res = E_OK;
  unsigned int len;

  if ( !field || !value || ((buffer < 0)||(buffer > field->nbuf)) )
    RETURN(E_BAD_ARGUMENT);

  len  = Buffer_Length(field);

  if (buffer==0)
    {
      const char *v;
      unsigned int i = 0;

      for(v=value; *v && (i<len); v++,i++)
        {
          if (!isprint((unsigned char)*v))
            RETURN(E_BAD_ARGUMENT);
        }
    }

  if (Growable(field))
    {
      /* for a growable field we must assume zero terminated strings, because
         somehow we have to detect the length of what should be copied.
      */
      unsigned int vlen = strlen(value);
      if (vlen > len)
        {
          if (!Field_Grown(field,
                           (int)(1 + (vlen-len)/((field->rows+field->nrow)*field->cols))))
            RETURN(E_SYSTEM_ERROR);

          /* in this case we also have to check, whether or not the remaining
             characters in value are also printable for buffer 0. */
          if (buffer==0)
            {
              unsigned int i;
          
              for(i=len; i<vlen; i++)
                if (!isprint((int)(value[i])))
                  RETURN(E_BAD_ARGUMENT);
            }
          len = vlen;
        }
    }
  
  p   = Address_Of_Nth_Buffer(field,buffer);

#if HAVE_MEMCCPY
  s = memccpy(p,value,0,len);
#else
  for(s=(char *)value; *s && (s < (value+len)); s++)
    p[s-value] = *s;
  if (s < (value+len))
    {
      int off = s-value;
      p[off] = *s++;
      s = p + (s-value);
    }
  else 
    s=(char *)0;
#endif

  if (s) 
    { /* this means, value was null terminated and not greater than the
         buffer. We have to pad with blanks. Please note that due to memccpy
         logic s points after the terminating null. */
      s--; /* now we point to the terminator. */
      assert(len >= (unsigned int)(s-p));
      if (len > (unsigned int)(s-p))
        memset(s,C_BLANK,len-(unsigned int)(s-p));
    }

  if (buffer==0)
    {
      int syncres;
      if (((syncres=Synchronize_Field( field ))!=E_OK) && 
          (res==E_OK))
        res = syncres;
      if (((syncres=Synchronize_Linked_Fields(field ))!=E_OK) &&
          (res==E_OK))
        res = syncres;
    }
  RETURN(res);
}